

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

int IDisk::AddByteToTrack(uchar *track,uint index,uchar byte,int size,uchar previous_bit)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  uint uVar6;
  bool bVar7;
  
  uVar2 = (ulong)index;
  if (track != (uchar *)0x0) {
    if (index != 0) {
      previous_bit = track[index - 1];
    }
    iVar4 = 0;
    if (0 < size) {
      iVar4 = size;
    }
    bVar5 = previous_bit == '\0';
    for (iVar3 = 7; iVar1 = (int)uVar2, iVar4 + iVar3 != 7; iVar3 = iVar3 + -1) {
      uVar6 = 1 << ((byte)iVar3 & 0x1f);
      bVar7 = (uVar6 & byte) == 0;
      track[uVar2] = bVar5 & bVar7;
      track[iVar1 + 1] = (uVar6 & byte) != 0;
      uVar2 = (ulong)(iVar1 + 2);
      bVar5 = bVar7;
    }
    return iVar1;
  }
  return index + size * 2;
}

Assistant:

int IDisk::AddByteToTrack(unsigned char* track, unsigned int index, unsigned char byte, int size,
                          unsigned char previous_bit)
{
   if (track == nullptr)
      return index + (size * 2);

   if (index > 0)
   {
      previous_bit = track[index - 1];
   }

   for (int i = 0; i < size; i++)
   {
      // Get bit
      unsigned char c = ((byte >> (7 - i)) & 0x01);

      if (c == 1)
      {
         track[index++] = 0;
         track[index] = 1;
      }
      else
      {
         track[index++] = (previous_bit == 0) ? 1 : 0;
         track[index] = 0;
      }

      previous_bit = track[index++];
   }
   return index;
}